

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

void lj_lib_register(lua_State *L,char *libname,uint8_t *p,lua_CFunction *cf)

{
  uint8_t uVar1;
  byte bVar2;
  uint64_t uVar3;
  uint uVar4;
  uint uVar5;
  uint nelems;
  GCtab *t;
  long lVar6;
  GCfunc *pGVar7;
  GCstr *pGVar8;
  TValue *pTVar9;
  uint8_t uVar10;
  lua_CFunction *p_00;
  GCfunc *fn;
  MSize nuv;
  char *name;
  MSize len;
  uint32_t tag;
  ptrdiff_t tpos;
  GCtab *tab;
  BCIns *bcff;
  GCfunc *pGStack_1e8;
  int ffid;
  GCfunc *ofn;
  GCtab *env;
  lua_CFunction *cf_local;
  uint8_t *p_local;
  char *libname_local;
  lua_State *L_local;
  GCobj *o;
  
  ofn = (GCfunc *)(L->env).gcptr64;
  pGStack_1e8 = (GCfunc *)0x0;
  uVar1 = *p;
  tab = (GCtab *)((L->glref).ptr64 + 0x1718 + (ulong)p[1] * 4);
  t = lib_create_table(L,libname,(uint)p[2]);
  lVar6 = (long)L->top - (long)L->base >> 3;
  if ((t->marked & 4) != 0) {
    uVar3 = (L->glref).ptr64;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr64 = *(uint64_t *)(uVar3 + 0x40);
    *(GCtab **)(uVar3 + 0x40) = t;
  }
  t->nomm = '\0';
  env = (GCtab *)cf;
  cf_local = (lua_CFunction *)(p + 3);
  do {
    while( true ) {
      p_00 = (lua_CFunction *)((long)cf_local + 1);
      bVar2 = *(byte *)cf_local;
      uVar4 = (uint)bVar2;
      uVar5 = uVar4 & 0x3f;
      if ((uVar4 & 0xc0) != 0xc0) break;
      switch(uVar4) {
      case 0xf9:
        cf_local = (lua_CFunction *)lib_read_lfunc(L,(uint8_t *)p_00,t);
        break;
      case 0xfa:
        L->top = L->top + -2;
        if (((int)L->top[1].field_4.it >> 0xf == -5) &&
           (*(int *)((L->top[1].u64 & 0x7fffffffffff) + 0x14) == 0)) {
          ofn = (GCfunc *)(L->top->u64 & 0x7fffffffffff);
          cf_local = p_00;
        }
        else {
          pTVar9 = lj_tab_set(L,t,L->top + 1);
          *pTVar9 = *L->top;
          cf_local = p_00;
        }
        break;
      case 0xfb:
        L->top->it64 = (int64_t)*p_00;
        L->top = L->top + 1;
        cf_local = (lua_CFunction *)((long)cf_local + 9);
        break;
      case 0xfc:
        *L->top = L->top[-(long)(int)(uint)*(byte *)p_00];
        L->top = L->top + 1;
        cf_local = (lua_CFunction *)((long)cf_local + 2);
        break;
      case 0xfd:
        pTVar9 = L->top;
        L->top = pTVar9 + 1;
        pTVar9->u64 = (ulong)pGStack_1e8 | 0xfffb800000000000;
        cf_local = p_00;
        break;
      case 0xfe:
        cf_local = p_00;
        uVar1 = uVar1 + '\x01';
        break;
      case 0xff:
        return;
      default:
        pTVar9 = L->top;
        L->top = pTVar9 + 1;
        pGVar8 = lj_str_new(L,(char *)p_00,(ulong)uVar5);
        pTVar9->u64 = (ulong)pGVar8 | 0xfffd800000000000;
        cf_local = (lua_CFunction *)((long)p_00 + (ulong)uVar5);
      }
    }
    nelems = (int)((long)L->top - (long)L->base >> 3) - (int)lVar6;
    pGVar7 = lj_func_newC(L,nelems,(GCtab *)&ofn->c);
    if (nelems != 0) {
      L->top = L->base + lVar6;
      memcpy((pGVar7->c).upvalue,L->top,(ulong)nelems << 3);
    }
    uVar10 = uVar1 + '\x01';
    (pGVar7->c).ffid = uVar1;
    cf_local = (lua_CFunction *)((long)p_00 + (ulong)uVar5);
    if ((bVar2 & 0xc0) == 0) {
      (pGVar7->c).pc.ptr64 = (L->glref).ptr64 + 0x168;
    }
    else {
      (pGVar7->c).pc.ptr64 = (uint64_t)tab;
      tab = (GCtab *)((long)&(tab->nextgc).gcptr64 + 4);
    }
    if ((uVar4 & 0xc0) == 0x80) {
      (pGVar7->c).f = (pGStack_1e8->c).f;
    }
    else {
      (pGVar7->l).uvptr[0].gcptr64 = (env->nextgc).gcptr64;
      env = (GCtab *)&env->marked;
    }
    pGStack_1e8 = pGVar7;
    uVar1 = uVar10;
    if ((bVar2 & 0x3f) != 0) {
      pGVar8 = lj_str_new(L,(char *)p_00,(ulong)uVar5);
      pTVar9 = lj_tab_setstr(L,t,pGVar8);
      pTVar9->u64 = (ulong)pGVar7 | 0xfffb800000000000;
    }
  } while( true );
}

Assistant:

void lj_lib_register(lua_State *L, const char *libname,
		     const uint8_t *p, const lua_CFunction *cf)
{
  GCtab *env = tabref(L->env);
  GCfunc *ofn = NULL;
  int ffid = *p++;
  BCIns *bcff = &L2GG(L)->bcff[*p++];
  GCtab *tab = lib_create_table(L, libname, *p++);
  ptrdiff_t tpos = L->top - L->base;

  /* Avoid barriers further down. */
  lj_gc_anybarriert(L, tab);
  tab->nomm = 0;

  for (;;) {
    uint32_t tag = *p++;
    MSize len = tag & LIBINIT_LENMASK;
    tag &= LIBINIT_TAGMASK;
    if (tag != LIBINIT_STRING) {
      const char *name;
      MSize nuv = (MSize)(L->top - L->base - tpos);
      GCfunc *fn = lj_func_newC(L, nuv, env);
      if (nuv) {
	L->top = L->base + tpos;
	memcpy(fn->c.upvalue, L->top, sizeof(TValue)*nuv);
      }
      fn->c.ffid = (uint8_t)(ffid++);
      name = (const char *)p;
      p += len;
      if (tag == LIBINIT_CF)
	setmref(fn->c.pc, &G(L)->bc_cfunc_int);
      else
	setmref(fn->c.pc, bcff++);
      if (tag == LIBINIT_ASM_)
	fn->c.f = ofn->c.f;  /* Copy handler from previous function. */
      else
	fn->c.f = *cf++;  /* Get cf or handler from C function table. */
      if (len) {
	/* NOBARRIER: See above for common barrier. */
	setfuncV(L, lj_tab_setstr(L, tab, lj_str_new(L, name, len)), fn);
      }
      ofn = fn;
    } else {
      switch (tag | len) {
      case LIBINIT_LUA:
	p = lib_read_lfunc(L, p, tab);
	break;
      case LIBINIT_SET:
	L->top -= 2;
	if (tvisstr(L->top+1) && strV(L->top+1)->len == 0)
	  env = tabV(L->top);
	else  /* NOBARRIER: See above for common barrier. */
	  copyTV(L, lj_tab_set(L, tab, L->top+1), L->top);
	break;
      case LIBINIT_NUMBER:
	memcpy(&L->top->n, p, sizeof(double));
	L->top++;
	p += sizeof(double);
	break;
      case LIBINIT_COPY:
	copyTV(L, L->top, L->top - *p++);
	L->top++;
	break;
      case LIBINIT_LASTCL:
	setfuncV(L, L->top++, ofn);
	break;
      case LIBINIT_FFID:
	ffid++;
	break;
      case LIBINIT_END:
	return;
      default:
	setstrV(L, L->top++, lj_str_new(L, (const char *)p, len));
	p += len;
	break;
      }
    }
  }
}